

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O0

bool __thiscall MT32Emu::Poly::noteOff(Poly *this,bool pedalHeld)

{
  bool pedalHeld_local;
  Poly *this_local;
  
  if ((this->state == POLY_Inactive) || (this->state == POLY_Releasing)) {
    this_local._7_1_ = false;
  }
  else {
    if (pedalHeld) {
      if (this->state == POLY_Held) {
        return false;
      }
      setState(this,POLY_Held);
    }
    else {
      startDecay(this);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Poly::noteOff(bool pedalHeld) {
	// Generally, non-sustaining instruments ignore note off. They die away eventually anyway.
	// Key 0 (only used by special cases on rhythm part) reacts to note off even if non-sustaining or pedal held.
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	if (pedalHeld) {
		if (state == POLY_Held) {
			return false;
		}
		setState(POLY_Held);
	} else {
		startDecay();
	}
	return true;
}